

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O2

void PredictorSub13_SSE2(uint32_t *in,uint32_t *upper,int num_pixels,uint32_t *out)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  ushort uVar9;
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  unkuint9 Var12;
  undefined1 auVar13 [11];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  long lVar18;
  long lVar19;
  short sVar20;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  undefined1 auVar21 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  short sVar36;
  undefined1 auVar37 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  ushort uVar47;
  short sVar48;
  undefined1 auVar49 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 uVar29;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  
  auVar17 = _DAT_001a96d0;
  auVar16 = _DAT_001a9670;
  lVar18 = 0;
  lVar19 = 0;
  while (lVar19 + 2 <= (long)num_pixels) {
    uVar1 = *(ulong *)((long)in + lVar18 + -4);
    uVar29 = (undefined1)(uVar1 >> 0x38);
    auVar26._8_6_ = 0;
    auVar26._0_8_ = uVar1;
    auVar26[0xe] = uVar29;
    auVar26[0xf] = uVar29;
    uVar29 = (undefined1)(uVar1 >> 0x30);
    auVar25._14_2_ = auVar26._14_2_;
    auVar25._8_5_ = 0;
    auVar25._0_8_ = uVar1;
    auVar25[0xd] = uVar29;
    auVar24._13_3_ = auVar25._13_3_;
    auVar24._8_4_ = 0;
    auVar24._0_8_ = uVar1;
    auVar24[0xc] = uVar29;
    uVar29 = (undefined1)(uVar1 >> 0x28);
    auVar23._12_4_ = auVar24._12_4_;
    auVar23._8_3_ = 0;
    auVar23._0_8_ = uVar1;
    auVar23[0xb] = uVar29;
    auVar22._11_5_ = auVar23._11_5_;
    auVar22._8_2_ = 0;
    auVar22._0_8_ = uVar1;
    auVar22[10] = uVar29;
    uVar29 = (undefined1)(uVar1 >> 0x20);
    auVar21._10_6_ = auVar22._10_6_;
    auVar21[8] = 0;
    auVar21._0_8_ = uVar1;
    auVar21[9] = uVar29;
    auVar49._9_7_ = auVar21._9_7_;
    auVar49[8] = uVar29;
    auVar49._0_8_ = uVar1;
    uVar29 = (undefined1)(uVar1 >> 0x18);
    auVar28._8_8_ = auVar49._8_8_;
    auVar28[7] = uVar29;
    auVar28[6] = uVar29;
    uVar29 = (undefined1)(uVar1 >> 0x10);
    auVar28[5] = uVar29;
    auVar28[4] = uVar29;
    uVar29 = (undefined1)(uVar1 >> 8);
    auVar28[3] = uVar29;
    auVar28[2] = uVar29;
    auVar28[0] = (undefined1)uVar1;
    auVar28[1] = auVar28[0];
    uVar2 = *(undefined8 *)((long)in + lVar18);
    uVar1 = *(ulong *)((long)upper + lVar18);
    uVar29 = (undefined1)(uVar1 >> 0x38);
    auVar43._8_6_ = 0;
    auVar43._0_8_ = uVar1;
    auVar43[0xe] = uVar29;
    auVar43[0xf] = uVar29;
    uVar29 = (undefined1)(uVar1 >> 0x30);
    auVar42._14_2_ = auVar43._14_2_;
    auVar42._8_5_ = 0;
    auVar42._0_8_ = uVar1;
    auVar42[0xd] = uVar29;
    auVar41._13_3_ = auVar42._13_3_;
    auVar41._8_4_ = 0;
    auVar41._0_8_ = uVar1;
    auVar41[0xc] = uVar29;
    uVar29 = (undefined1)(uVar1 >> 0x28);
    auVar40._12_4_ = auVar41._12_4_;
    auVar40._8_3_ = 0;
    auVar40._0_8_ = uVar1;
    auVar40[0xb] = uVar29;
    auVar39._11_5_ = auVar40._11_5_;
    auVar39._8_2_ = 0;
    auVar39._0_8_ = uVar1;
    auVar39[10] = uVar29;
    uVar29 = (undefined1)(uVar1 >> 0x20);
    auVar38._10_6_ = auVar39._10_6_;
    auVar38[8] = 0;
    auVar38._0_8_ = uVar1;
    auVar38[9] = uVar29;
    auVar37._9_7_ = auVar38._9_7_;
    auVar37[8] = uVar29;
    auVar37._0_8_ = uVar1;
    uVar29 = (undefined1)(uVar1 >> 0x18);
    auVar44._8_8_ = auVar37._8_8_;
    auVar44[7] = uVar29;
    auVar44[6] = uVar29;
    uVar29 = (undefined1)(uVar1 >> 0x10);
    auVar44[5] = uVar29;
    auVar44[4] = uVar29;
    uVar29 = (undefined1)(uVar1 >> 8);
    auVar44[3] = uVar29;
    auVar44[2] = uVar29;
    auVar44[0] = (undefined1)uVar1;
    auVar44[1] = auVar44[0];
    uVar1 = *(ulong *)((long)upper + lVar18 + -4);
    auVar3._8_6_ = 0;
    auVar3._0_8_ = uVar1;
    auVar3[0xe] = (char)(uVar1 >> 0x38);
    auVar4._8_4_ = 0;
    auVar4._0_8_ = uVar1;
    auVar4[0xc] = (char)(uVar1 >> 0x30);
    auVar4._13_2_ = auVar3._13_2_;
    auVar5._8_4_ = 0;
    auVar5._0_8_ = uVar1;
    auVar5._12_3_ = auVar4._12_3_;
    auVar6._8_2_ = 0;
    auVar6._0_8_ = uVar1;
    auVar6[10] = (char)(uVar1 >> 0x28);
    auVar6._11_4_ = auVar5._11_4_;
    auVar7._8_2_ = 0;
    auVar7._0_8_ = uVar1;
    auVar7._10_5_ = auVar6._10_5_;
    auVar8[8] = (char)(uVar1 >> 0x20);
    auVar8._0_8_ = uVar1;
    auVar8._9_6_ = auVar7._9_6_;
    auVar11._7_8_ = 0;
    auVar11._0_7_ = auVar8._8_7_;
    Var12 = CONCAT81(SUB158(auVar11 << 0x40,7),(char)(uVar1 >> 0x18));
    auVar14._9_6_ = 0;
    auVar14._0_9_ = Var12;
    auVar13._1_10_ = SUB1510(auVar14 << 0x30,5);
    auVar13[0] = (char)(uVar1 >> 0x10);
    auVar15._11_4_ = 0;
    auVar15._0_11_ = auVar13;
    auVar10[2] = (char)(uVar1 >> 8);
    auVar10._0_2_ = (ushort)uVar1;
    auVar10._3_12_ = SUB1512(auVar15 << 0x20,3);
    uVar47 = (ushort)uVar1 & 0xff;
    auVar49 = auVar44 & auVar28;
    auVar44 = auVar44 ^ auVar28;
    auVar45._0_2_ = auVar44._0_2_ >> 1;
    auVar45._2_2_ = auVar44._2_2_ >> 1;
    auVar45._4_2_ = auVar44._4_2_ >> 1;
    auVar45._6_2_ = auVar44._6_2_ >> 1;
    auVar45._8_2_ = auVar44._8_2_ >> 1;
    auVar45._10_2_ = auVar44._10_2_ >> 1;
    auVar45._12_2_ = auVar44._12_2_ >> 1;
    auVar45._14_2_ = auVar44._14_2_ >> 1;
    auVar45 = auVar45 & auVar16;
    auVar46[0] = auVar45[0] + auVar49[0];
    auVar46[1] = auVar45[1] + auVar49[1];
    auVar46[2] = auVar45[2] + auVar49[2];
    auVar46[3] = auVar45[3] + auVar49[3];
    auVar46[4] = auVar45[4] + auVar49[4];
    auVar46[5] = auVar45[5] + auVar49[5];
    auVar46[6] = auVar45[6] + auVar49[6];
    auVar46[7] = auVar45[7] + auVar49[7];
    auVar46[8] = auVar45[8] + auVar49[8];
    auVar46[9] = auVar45[9] + auVar49[9];
    auVar46[10] = auVar45[10] + auVar49[10];
    auVar46[0xb] = auVar45[0xb] + auVar49[0xb];
    auVar46[0xc] = auVar45[0xc] + auVar49[0xc];
    auVar46[0xd] = auVar45[0xd] + auVar49[0xd];
    auVar46[0xe] = auVar45[0xe] + auVar49[0xe];
    auVar46[0xf] = auVar45[0xf] + auVar49[0xf];
    auVar46 = auVar46 & auVar17;
    sVar20 = auVar46._0_2_;
    sVar30 = auVar46._2_2_;
    sVar31 = auVar46._4_2_;
    sVar32 = auVar46._6_2_;
    sVar48 = (short)Var12;
    sVar33 = auVar46._8_2_;
    sVar34 = auVar46._10_2_;
    sVar35 = auVar46._12_2_;
    sVar36 = auVar46._14_2_;
    uVar9 = auVar3._13_2_ >> 8;
    auVar27._0_2_ = (sVar20 - uVar47) + (ushort)(sVar20 < (short)uVar47);
    auVar27._2_2_ = (sVar30 - auVar10._2_2_) + (ushort)(sVar30 < auVar10._2_2_);
    auVar27._4_2_ = (sVar31 - auVar13._0_2_) + (ushort)(sVar31 < auVar13._0_2_);
    auVar27._6_2_ = (sVar32 - sVar48) + (ushort)(sVar32 < sVar48);
    auVar27._8_2_ = (sVar33 - auVar8._8_2_) + (ushort)(sVar33 < auVar8._8_2_);
    auVar27._10_2_ = (sVar34 - auVar6._10_2_) + (ushort)(sVar34 < auVar6._10_2_);
    auVar27._12_2_ = (sVar35 - auVar4._12_2_) + (ushort)(sVar35 < auVar4._12_2_);
    auVar27._14_2_ = (sVar36 - uVar9) + (ushort)(sVar36 < (short)uVar9);
    auVar28 = psraw(auVar27,1);
    sVar20 = auVar28._0_2_ + sVar20;
    sVar30 = auVar28._2_2_ + sVar30;
    sVar31 = auVar28._4_2_ + sVar31;
    sVar32 = auVar28._6_2_ + sVar32;
    sVar33 = auVar28._8_2_ + sVar33;
    sVar34 = auVar28._10_2_ + sVar34;
    sVar35 = auVar28._12_2_ + sVar35;
    sVar36 = auVar28._14_2_ + sVar36;
    *(ulong *)((long)out + lVar18) =
         CONCAT17((char)((ulong)uVar2 >> 0x38) -
                  ((0 < sVar36) * (sVar36 < 0x100) * (char)sVar36 - (0xff < sVar36)),
                  CONCAT16((char)((ulong)uVar2 >> 0x30) -
                           ((0 < sVar35) * (sVar35 < 0x100) * (char)sVar35 - (0xff < sVar35)),
                           CONCAT15((char)((ulong)uVar2 >> 0x28) -
                                    ((0 < sVar34) * (sVar34 < 0x100) * (char)sVar34 -
                                    (0xff < sVar34)),
                                    CONCAT14((char)((ulong)uVar2 >> 0x20) -
                                             ((0 < sVar33) * (sVar33 < 0x100) * (char)sVar33 -
                                             (0xff < sVar33)),
                                             CONCAT13((char)((ulong)uVar2 >> 0x18) -
                                                      ((0 < sVar32) * (sVar32 < 0x100) *
                                                       (char)sVar32 - (0xff < sVar32)),
                                                      CONCAT12((char)((ulong)uVar2 >> 0x10) -
                                                               ((0 < sVar31) * (sVar31 < 0x100) *
                                                                (char)sVar31 - (0xff < sVar31)),
                                                               CONCAT11((char)((ulong)uVar2 >> 8) -
                                                                        ((0 < sVar30) *
                                                                         (sVar30 < 0x100) *
                                                                         (char)sVar30 -
                                                                        (0xff < sVar30)),
                                                                        (char)uVar2 -
                                                                        ((0 < sVar20) *
                                                                         (sVar20 < 0x100) *
                                                                         (char)sVar20 -
                                                                        (0xff < sVar20)))))))));
    lVar18 = lVar18 + 8;
    lVar19 = lVar19 + 2;
  }
  if (num_pixels == (int)lVar19) {
    return;
  }
  (*VP8LPredictorsSub_C[0xd])
            ((uint32_t *)((long)in + lVar18),(uint32_t *)((long)upper + lVar18),
             num_pixels - (int)lVar19,(uint32_t *)((long)out + lVar18));
  return;
}

Assistant:

static void PredictorSub13_SSE2(const uint32_t* in, const uint32_t* upper,
                                int num_pixels, uint32_t* WEBP_RESTRICT out) {
  int i;
  const __m128i zero = _mm_setzero_si128();
  for (i = 0; i + 2 <= num_pixels; i += 2) {
    // we can only process two pixels at a time
    const __m128i L = _mm_loadl_epi64((const __m128i*)&in[i - 1]);
    const __m128i src = _mm_loadl_epi64((const __m128i*)&in[i]);
    const __m128i T = _mm_loadl_epi64((const __m128i*)&upper[i]);
    const __m128i TL = _mm_loadl_epi64((const __m128i*)&upper[i - 1]);
    const __m128i L_lo = _mm_unpacklo_epi8(L, zero);
    const __m128i T_lo = _mm_unpacklo_epi8(T, zero);
    const __m128i TL_lo = _mm_unpacklo_epi8(TL, zero);
    const __m128i sum = _mm_add_epi16(T_lo, L_lo);
    const __m128i avg = _mm_srli_epi16(sum, 1);
    const __m128i A1 = _mm_sub_epi16(avg, TL_lo);
    const __m128i bit_fix = _mm_cmpgt_epi16(TL_lo, avg);
    const __m128i A2 = _mm_sub_epi16(A1, bit_fix);
    const __m128i A3 = _mm_srai_epi16(A2, 1);
    const __m128i A4 = _mm_add_epi16(avg, A3);
    const __m128i pred = _mm_packus_epi16(A4, A4);
    const __m128i res = _mm_sub_epi8(src, pred);
    _mm_storel_epi64((__m128i*)&out[i], res);
  }
  if (i != num_pixels) {
    VP8LPredictorsSub_C[13](in + i, upper + i, num_pixels - i, out + i);
  }
}